

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

value_type * __thiscall
wasm::Random::
pick<std::vector<std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>>
          (Random *this,
          vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
          *vec)

{
  bool bVar1;
  uint32_t uVar2;
  size_type sVar3;
  const_reference pvVar4;
  uint32_t index;
  vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
  *vec_local;
  Random *this_local;
  
  bVar1 = std::
          vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
          ::empty(vec);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!vec.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/random.h"
                  ,0x50,
                  "const typename T::value_type &wasm::Random::pick(const T &) [T = std::vector<std::pair<wasm::HeapType, unsigned int>>]"
                 );
  }
  sVar3 = std::
          vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
          ::size(vec);
  uVar2 = upTo(this,(uint32_t)sVar3);
  pvVar4 = std::
           vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
           ::operator[](vec,(ulong)uVar2);
  return pvVar4;
}

Assistant:

const typename T::value_type& pick(const T& vec) {
    assert(!vec.empty());
    auto index = upTo(vec.size());
    return vec[index];
  }